

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iniparser.c
# Opt level: O2

char * strlwc(char *in,char *out,uint len)

{
  int iVar1;
  ulong uVar2;
  
  if (len == 0 || (out == (char *)0x0 || in == (char *)0x0)) {
    out = (char *)0x0;
  }
  else {
    for (uVar2 = 0; (uVar2 < len - 1 && (in[uVar2] != '\0')); uVar2 = uVar2 + 1) {
      iVar1 = tolower((int)in[uVar2]);
      out[uVar2] = (char)iVar1;
    }
    out[uVar2] = '\0';
  }
  return out;
}

Assistant:

static const char * strlwc(const char * in, char *out, unsigned len)
{
    unsigned i ;

    if (in == NULL || out == NULL || len == 0) return NULL ;
    i = 0 ;
    while (in[i] != '\0' && i < len - 1) {
        out[i] = (char)tolower((int)in[i]);
        i++ ;
    }
    out[i] = '\0';
    return out ;
}